

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ossl_bio_cf_out_write(BIO *bio,char *buf,int blen)

{
  long lVar1;
  Curl_easy *data;
  curl_trc_feat *pcVar2;
  Curl_cfilter *cf;
  ulong uVar3;
  CURLcode result;
  
  cf = (Curl_cfilter *)BIO_get_data();
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  data = *(Curl_easy **)((long)cf->ctx + 0x38);
  result = CURLE_SEND_ERROR;
  if (blen < 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = Curl_conn_cf_send(cf->next,data,buf,(ulong)(uint)blen,false,&result);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"ossl_bio_cf_out_write(len=%d) -> %d, err=%d",(ulong)(uint)blen,
                        uVar3 & 0xffffffff,(ulong)result);
    }
    BIO_clear_flags((BIO *)bio,0xf);
    *(CURLcode *)(lVar1 + 0x20) = result;
    if (result == CURLE_AGAIN && (long)uVar3 < 0) {
      BIO_set_flags((BIO *)bio,10);
    }
  }
  return (int)uVar3;
}

Assistant:

static int ossl_bio_cf_out_write(BIO *bio, const char *buf, int blen)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);
  ssize_t nwritten;
  CURLcode result = CURLE_SEND_ERROR;

  DEBUGASSERT(data);
  if(blen < 0)
    return 0;

  nwritten = Curl_conn_cf_send(cf->next, data, buf, (size_t)blen, FALSE,
                               &result);
  CURL_TRC_CF(data, cf, "ossl_bio_cf_out_write(len=%d) -> %d, err=%d",
              blen, (int)nwritten, result);
  BIO_clear_retry_flags(bio);
  octx->io_result = result;
  if(nwritten < 0) {
    if(CURLE_AGAIN == result)
      BIO_set_retry_write(bio);
  }
  return (int)nwritten;
}